

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall
TPZVec<TPZEqnArray<long_double>_>::TPZVec
          (TPZVec<TPZEqnArray<long_double>_> *this,TPZVec<TPZEqnArray<long_double>_> *rval)

{
  _func_int **pp_Var1;
  undefined1 auVar2 [16];
  ulong uVar3;
  TPZEqnArray<long_double> *this_00;
  int **ppiVar4;
  long in_RSI;
  undefined8 *in_RDI;
  ulong uVar5;
  int64_t i;
  TPZEqnArray<long_double> *in_stack_ffffffffffffff88;
  TPZEqnArray<long_double> *in_stack_ffffffffffffff90;
  int **local_58;
  long local_28;
  
  *in_RDI = &PTR__TPZVec_02550a28;
  in_RDI[2] = *(undefined8 *)(in_RSI + 0x10);
  if (*(long *)(in_RSI + 0x18) == 0) {
    pp_Var1 = (_func_int **)in_RDI[2];
    auVar2._8_8_ = 0;
    auVar2._0_8_ = pp_Var1;
    uVar3 = SUB168(auVar2 * ZEXT816(0x51e0),0);
    uVar5 = uVar3 + 0x10;
    if (SUB168(auVar2 * ZEXT816(0x51e0),8) != 0 || 0xffffffffffffffef < uVar3) {
      uVar5 = 0xffffffffffffffff;
    }
    this_00 = (TPZEqnArray<long_double> *)operator_new__(uVar5);
    (this_00->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>._vptr_TPZVec = pp_Var1;
    ppiVar4 = &(this_00->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore;
    if (pp_Var1 != (_func_int **)0x0) {
      local_58 = ppiVar4;
      do {
        TPZEqnArray<long_double>::TPZEqnArray(this_00);
        local_58 = local_58 + 0xa3c;
      } while (local_58 != ppiVar4 + (long)pp_Var1 * 0xa3c);
    }
    in_RDI[1] = ppiVar4;
    for (local_28 = 0; local_28 < (long)in_RDI[2]; local_28 = local_28 + 1) {
      TPZEqnArray<long_double>::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
  }
  else {
    in_RDI[1] = *(undefined8 *)(in_RSI + 8);
    in_RDI[3] = *(undefined8 *)(in_RSI + 0x18);
    *(undefined8 *)(in_RSI + 8) = 0;
    *(undefined8 *)(in_RSI + 0x18) = 0;
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec(TPZVec<T> &&rval) : fNElements(rval.fNElements){
    if(rval.fNAlloc){
        fStore = rval.fStore;
        fNAlloc = rval.fNAlloc;
        rval.fStore = nullptr;
        rval.fNAlloc = 0;
    }else{//rval did not allocate memory. let us just copy
        fStore = new T[fNElements];
        for(int64_t i=0; i<fNElements; i++)
            fStore[i]=rval.fStore[i];
    }
    
}